

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

Buffer * __thiscall
Potassco::StringBuilder::buffer(Buffer *__return_storage_ptr__,StringBuilder *this)

{
  size_t sVar1;
  anon_union_64_3_812e3e79_for_StringBuilder_0 *paVar2;
  byte bVar3;
  size_type sVar4;
  size_type sVar5;
  
  bVar3 = (this->field_0).sbo_[0x3f] & 0xc0;
  if (bVar3 == 0x40) {
    paVar2 = &this->field_0;
    this = (StringBuilder *)(paVar2->str_->_M_dataplus)._M_p;
    sVar4 = paVar2->str_->_M_string_length;
    sVar5 = sVar4;
  }
  else {
    if (bVar3 == 0x80) {
      __return_storage_ptr__->size = (this->field_0).buf_.size;
      sVar1 = (this->field_0).buf_.used;
      __return_storage_ptr__->head = (char *)(this->field_0).str_;
      __return_storage_ptr__->used = sVar1;
      return __return_storage_ptr__;
    }
    sVar4 = 0x3f;
    sVar5 = 0x3f - (ulong)(byte)(this->field_0).sbo_[0x3f];
  }
  __return_storage_ptr__->head = (char *)this;
  __return_storage_ptr__->used = sVar5;
  __return_storage_ptr__->size = sVar4;
  return __return_storage_ptr__;
}

Assistant:

StringBuilder::Buffer StringBuilder::buffer() const {
	Buffer r;
	switch (type()) {
		default: assert(false);
		case Sbo: r.head = const_cast<char*>(sbo_); r.size = SboCap; r.used = SboCap - tag(); break;
		case Str: r.head = const_cast<char*>(str_->c_str()); r.size = r.used = str_->size();  break;
		case Buf: return buf_;
	}
	return r;
}